

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O0

int resampler_output_delay(resampler *r)

{
  uchar uVar1;
  resampler *r_local;
  int local_4;
  
  uVar1 = r->quality;
  if ((uVar1 == '\0') || ((uVar1 != '\x01' && ((uVar1 == '\x02' || (uVar1 != '\x03')))))) {
    local_4 = 0;
  }
  else {
    local_4 = 0xf;
  }
  return local_4;
}

Assistant:

static int resampler_output_delay(resampler *r)
{
    switch (r->quality)
    {
    default:
    case RESAMPLER_QUALITY_ZOH:
    case RESAMPLER_QUALITY_LINEAR:
    case RESAMPLER_QUALITY_CUBIC:
    case RESAMPLER_QUALITY_SINC:
        return 0;
            
    case RESAMPLER_QUALITY_BLEP:
    case RESAMPLER_QUALITY_BLAM:
        return SINC_WIDTH - 1;
    }
}